

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::TestInfo::~TestInfo(TestInfo *this)

{
  if (this->factory_ != (TestFactoryBase *)0x0) {
    (*this->factory_->_vptr_TestFactoryBase[1])();
  }
  TestResult::~TestResult(&this->result_);
  std::__cxx11::string::_M_dispose();
  std::
  unique_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&this->value_param_);
  std::
  unique_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&this->type_param_);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

TestInfo::~TestInfo() { delete factory_; }